

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetStateBlock
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *mD)

{
  ulong *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  element_type *peVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  void *pvVar24;
  double *pdVar25;
  undefined8 *puVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  ChVector<double> displ;
  long local_98 [4];
  double dStack_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_30;
  
  if ((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar6 != (double *)0x0) {
      free((void *)pdVar6[-1]);
    }
    pvVar24 = malloc(0xa0);
    if (pvVar24 == (void *)0x0) {
      puVar26 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar26 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar26,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar24 & 0xffffffffffffffc0) + 0x38) = pvVar24;
    (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)(((ulong)pvVar24 & 0xffffffffffffffc0) + 0x40);
  }
  (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0xc;
  local_98[2] = 0;
  uVar28 = 3;
  local_98[0] = 0;
  local_98[1] = 0;
  dVar37 = (this->q_element_abs_rot).m_data[0];
  dVar48 = (this->q_element_abs_rot).m_data[2];
  dVar54 = (this->q_element_abs_rot).m_data[1];
  dVar79 = (this->q_element_abs_rot).m_data[3];
  peVar7 = (((this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = -0.0;
  uStack_40 = 0x8000000000000000;
  dVar17 = dVar37 * dVar37;
  dVar37 = -dVar37;
  dVar2 = *(double *)&peVar7->field_0x28;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)((long)&peVar7->super_ChNodeFEAbase + 0x20);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)&peVar7->field_0x30;
  dVar3 = *(double *)((long)&peVar7->X0 + 0x10);
  dVar4 = *(double *)((long)&peVar7->X0 + 0x18);
  dVar5 = (this->q_element_ref_rot).m_data[2];
  dVar18 = dVar54 * dVar48 - dVar79 * dVar37;
  dVar16 = dVar54 * dVar48 + dVar79 * dVar37;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar17 + dVar48 * dVar48;
  auVar30 = vfmadd213sd_avx512f(auVar80,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar17 + dVar54 * dVar54;
  auVar31 = vfmadd213sd_avx512f(auVar31,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar17 + dVar79 * dVar79;
  auVar56 = ZEXT816(0xbff0000000000000);
  auVar57 = ZEXT816(0x4000000000000000);
  auVar32 = vfmadd213sd_avx512f(auVar32,auVar57,auVar56);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar16 + dVar16;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar2 * auVar30._0_8_;
  auVar30 = vfmadd231sd_fma(auVar81,auVar124,auVar38);
  dVar19 = dVar48 * dVar79 - dVar54 * dVar37;
  dVar16 = dVar54 * dVar37 + dVar48 * dVar79;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar2 * (dVar18 + dVar18);
  auVar31 = vfmadd231sd_fma(auVar92,auVar124,auVar31);
  dVar17 = dVar48 * dVar37 + dVar54 * dVar79;
  dVar54 = dVar54 * dVar79 - dVar48 * dVar37;
  dVar37 = (this->q_element_ref_rot).m_data[3];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar19 + dVar19;
  auVar30 = vfmadd213sd_fma(auVar39,auVar130,auVar30);
  dVar48 = (this->q_element_ref_rot).m_data[1];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar17 + dVar17;
  auVar31 = vfmadd213sd_fma(auVar66,auVar130,auVar31);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar54 + dVar54;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2 * (dVar16 + dVar16);
  auVar38 = vfmadd231sd_fma(auVar73,auVar124,auVar55);
  dVar54 = (this->q_element_ref_rot).m_data[0];
  auVar38 = vfmadd213sd_fma(auVar32,auVar130,auVar38);
  dVar16 = dVar54 * dVar54;
  dVar54 = -dVar54;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)&((ChCoordsys<double> *)((long)&peVar7->X0 + 8))->pos;
  dVar2 = dVar48 * dVar5 - dVar37 * dVar54;
  dVar79 = dVar48 * dVar5 + dVar37 * dVar54;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar16 + dVar48 * dVar48;
  auVar32 = vfmadd213sd_avx512f(auVar93,auVar57,auVar56);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar3 * (dVar2 + dVar2);
  auVar32 = vfmadd231sd_fma(auVar132,auVar114,auVar32);
  dVar2 = dVar5 * dVar54 + dVar37 * dVar48;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar2 + dVar2;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar4;
  auVar32 = vfmadd213sd_avx512f(auVar94,auVar134,auVar32);
  dStack_60 = auVar31._0_8_ - auVar32._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar5 * dVar5 + dVar16;
  auVar31 = vfmadd213sd_avx512f(auVar95,auVar57,auVar56);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar37 * dVar37 + dVar16;
  auVar32 = vfmadd213sd_avx512f(auVar74,auVar57,auVar56);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar79 + dVar79;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar3 * auVar31._0_8_;
  auVar31 = vfmadd231sd_fma(auVar96,auVar114,auVar56);
  dVar79 = dVar37 * dVar5 - dVar48 * dVar54;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar79 + dVar79;
  auVar31 = vfmadd213sd_avx512f(auVar57,auVar134,auVar31);
  local_58 = auVar30._0_8_ - auVar31._0_8_;
  dVar79 = dVar37 * dVar48 - dVar5 * dVar54;
  dVar37 = dVar48 * dVar54 + dVar37 * dVar5;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar79 + dVar79;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar3 * (dVar37 + dVar37);
  auVar30 = vfmadd231sd_fma(auVar82,auVar114,auVar30);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar4;
  auVar30 = vfmadd213sd_avx512f(auVar32,auVar135,auVar30);
  local_50 = auVar38._0_8_ - auVar30._0_8_;
  pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar23 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if (uVar23 < 3) {
      uVar28 = uVar23;
    }
    if (uVar23 != 0) goto LAB_00669d3b;
  }
  else {
LAB_00669d3b:
    memcpy(pdVar6,&dStack_60,(ulong)(uVar28 * 8));
  }
  if (uVar28 < 3) {
    uVar29 = (ulong)(uVar28 << 3);
    memcpy((void *)((long)pdVar6 + uVar29),(void *)((long)&dStack_60 + uVar29),0x18 - uVar29);
  }
  dVar37 = (this->q_element_abs_rot).m_data[1];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar37;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(double *)&peVar7->field_0x40;
  dVar48 = *(double *)&peVar7->field_0x38;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar48;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = (this->q_element_abs_rot).m_data[0];
  dVar54 = (this->q_element_abs_rot).m_data[2];
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar54;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)&peVar7->field_0x48;
  dVar79 = (this->q_element_abs_rot).m_data[3];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar79;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)&peVar7->field_0x50;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(double *)&peVar7->field_0x40 * dVar37;
  auVar30 = vfmadd231sd_fma(auVar58,auVar40,auVar106);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar48 * dVar37;
  auVar31 = vfmsub231sd_fma(auVar67,auVar40,auVar110);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar48 * dVar54;
  auVar38 = vfmsub231sd_fma(auVar75,auVar40,auVar115);
  auVar30 = vfmadd231sd_fma(auVar30,auVar97,auVar115);
  auVar31 = vfmadd231sd_fma(auVar31,auVar83,auVar115);
  auVar38 = vfnmadd231sd_fma(auVar38,auVar83,auVar110);
  auVar30 = vfmadd231sd_fma(auVar30,auVar83,auVar120);
  auVar55 = vfnmadd231sd_fma(auVar31,auVar97,auVar120);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = (this->q_refrotA).m_data[2];
  auVar31 = vfmadd231sd_fma(auVar38,auVar49,auVar120);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar48 * dVar79;
  auVar38 = vfmsub231sd_fma(auVar84,auVar40,auVar120);
  auVar42 = SUB6416(ZEXT864(0),0);
  auVar38 = vfmadd231sd_fma(auVar38,auVar97,auVar110);
  dVar37 = (this->q_refrotA).m_data[0];
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar37;
  dVar48 = (this->q_refrotA).m_data[1];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar48;
  auVar56 = vfnmadd231sd_fma(auVar38,auVar49,auVar115);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = (this->q_refrotA).m_data[3];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar37 * auVar31._0_8_;
  auVar38 = vfnmadd231sd_fma(auVar125,auVar30,auVar107);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar37 * auVar55._0_8_;
  auVar32 = vfnmadd231sd_fma(auVar121,auVar30,auVar111);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar37 * auVar56._0_8_;
  auVar39 = vfnmadd231sd_fma(auVar128,auVar30,auVar50);
  auVar57 = vfnmadd231sd_fma(auVar38,auVar56,auVar111);
  auVar38 = vfmadd231sd_fma(auVar32,auVar56,auVar107);
  auVar32 = vfmadd231sd_fma(auVar39,auVar31,auVar111);
  auVar39 = vfmadd231sd_fma(auVar57,auVar55,auVar50);
  auVar57 = vfnmadd231sd_fma(auVar38,auVar31,auVar50);
  auVar32 = vfnmadd231sd_fma(auVar32,auVar55,auVar107);
  dVar37 = auVar39._0_8_;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar37 * dVar37;
  auVar38 = vfmadd231sd_fma(auVar116,auVar57,auVar57);
  auVar38 = vfmadd231sd_fma(auVar38,auVar32,auVar32);
  if (auVar38._0_8_ <= 0.0) {
    local_98[0] = 0x3ff0000000000000;
    local_98[1] = 0;
    local_98[2] = 0;
  }
  else {
    dStack_78 = auVar57._0_8_;
    dStack_68 = auVar32._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar48 * auVar55._0_8_;
    auVar32 = vfmadd213sd_fma(auVar98,auVar30,auVar41);
    auVar30 = vsqrtsd_avx(auVar38,auVar38);
    auVar31 = vfmadd213sd_fma(auVar107,auVar31,auVar32);
    auVar31 = vfmadd213sd_fma(auVar50,auVar56,auVar31);
    local_30 = auVar30._0_8_;
    dStack_70 = dVar37;
    dVar37 = atan2(local_30,auVar31._0_8_);
    dVar37 = dVar37 + dVar37;
    dVar54 = 1.0 / local_30;
    dVar48 = dVar54 * dStack_70;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar54 * dStack_78;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = dVar48 * dVar48;
    auVar30 = vfmadd231sd_fma(auVar85,auVar68,auVar68);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar54 * dStack_68;
    auVar30 = vfmadd231sd_fma(auVar30,auVar59,auVar59);
    auVar30 = vsqrtsd_avx(auVar30,auVar30);
    dVar79 = 1.0 / auVar30._0_8_;
    bVar9 = 2.2250738585072014e-308 <= auVar30._0_8_;
    local_98[0] = (ulong)bVar9 * (long)(dVar54 * dStack_78 * dVar79) +
                  (ulong)!bVar9 * 0x3ff0000000000000;
    local_98[1] = (ulong)bVar9 * (long)(dVar48 * dVar79);
    local_98[2] = (ulong)bVar9 * (long)(dVar54 * dStack_68 * dVar79);
    if (dVar37 <= 3.141592653589793) {
      if (dVar37 < -3.141592653589793) {
        dVar48 = 6.283185307179586;
        goto LAB_00669f6d;
      }
    }
    else {
      dVar48 = -6.283185307179586;
LAB_00669f6d:
      dVar37 = dVar37 + dVar48;
    }
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar37;
    if (3.141592653589793 < dVar37) {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar37 + -6.283185307179586;
    }
  }
  lVar8 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar8 < 6) goto LAB_0066a553;
  pdVar25 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar28 = 3;
  pdVar6 = pdVar25 + 3;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar23 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if (uVar23 < 3) {
      uVar28 = uVar23;
    }
    if (uVar23 != 0) goto LAB_00669fb8;
  }
  else {
LAB_00669fb8:
    auVar34 = vbroadcastsd_avx512f(auVar42);
    auVar35 = vpbroadcastq_avx512f();
    uVar29 = vpcmpuq_avx512f(auVar35,_DAT_00974f00,5);
    auVar35._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * local_98[1];
    auVar35._0_8_ = (ulong)((byte)uVar29 & 1) * local_98[0];
    auVar35._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * local_98[2];
    auVar35._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * local_98[3];
    auVar35._32_8_ = (ulong)((byte)(uVar29 >> 4) & 1) * (long)dStack_78;
    auVar35._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * (long)dStack_70;
    auVar35._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * (long)dStack_68;
    auVar35._56_8_ = (uVar29 >> 7) * (long)dStack_60;
    auVar34 = vmulpd_avx512f(auVar34,auVar35);
    bVar9 = (bool)((byte)uVar29 & 1);
    bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
    bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
    bVar13 = (bool)((byte)(uVar29 >> 4) & 1);
    bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
    bVar15 = (bool)((byte)(uVar29 >> 6) & 1);
    *pdVar6 = (double)((ulong)bVar9 * auVar34._0_8_ | (ulong)!bVar9 * (long)*pdVar6);
    pdVar25[4] = (double)((ulong)bVar10 * auVar34._8_8_ | (ulong)!bVar10 * (long)pdVar25[4]);
    pdVar25[5] = (double)((ulong)bVar11 * auVar34._16_8_ | (ulong)!bVar11 * (long)pdVar25[5]);
    pdVar25[6] = (double)((ulong)bVar12 * auVar34._24_8_ | (ulong)!bVar12 * (long)pdVar25[6]);
    pdVar25[7] = (double)((ulong)bVar13 * auVar34._32_8_ | (ulong)!bVar13 * (long)pdVar25[7]);
    pdVar25[8] = (double)((ulong)bVar14 * auVar34._40_8_ | (ulong)!bVar14 * (long)pdVar25[8]);
    pdVar25[9] = (double)((ulong)bVar15 * auVar34._48_8_ | (ulong)!bVar15 * (long)pdVar25[9]);
    pdVar25[10] = (double)((uVar29 >> 7) * auVar34._56_8_ |
                          (ulong)!SUB81(uVar29 >> 7,0) * (long)pdVar25[10]);
  }
  if (uVar28 < 3) {
    dVar37 = auVar42._0_8_;
    uVar27 = (ulong)(uVar28 << 3);
    auVar33 = vpbroadcastq_avx512vl();
    uVar29 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
    uVar29 = uVar29 & 0xf;
    lVar20 = *(long *)((long)local_98 + uVar27 + 8);
    lVar21 = *(long *)((long)local_98 + uVar27 + 0x10);
    lVar22 = *(long *)((long)local_98 + uVar27 + 0x18);
    puVar1 = (ulong *)((long)pdVar6 + uVar27);
    bVar9 = (bool)((byte)uVar29 & 1);
    bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
    *puVar1 = (ulong)bVar9 *
              (long)(dVar37 * (double)((ulong)((byte)uVar29 & 1) *
                                      *(long *)((long)local_98 + uVar27))) | (ulong)!bVar9 * *puVar1
    ;
    puVar1[1] = (ulong)bVar10 * (long)(dVar37 * (double)((ulong)((byte)(uVar29 >> 1) & 1) * lVar20))
                | (ulong)!bVar10 * puVar1[1];
    puVar1[2] = (ulong)bVar11 * (long)(dVar37 * (double)((ulong)((byte)(uVar29 >> 2) & 1) * lVar21))
                | (ulong)!bVar11 * puVar1[2];
    puVar1[3] = (uVar29 >> 3) * (long)(dVar37 * (double)((uVar29 >> 3) * lVar22)) |
                (ulong)!SUB81(uVar29 >> 3,0) * puVar1[3];
  }
  dVar37 = (this->q_element_abs_rot).m_data[0];
  dVar48 = (this->q_element_abs_rot).m_data[2];
  dVar54 = (this->q_element_abs_rot).m_data[1];
  dVar79 = (this->q_element_abs_rot).m_data[3];
  peVar7 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar17 = dVar37 * dVar37;
  dVar37 = (double)((ulong)local_48 ^ (ulong)dVar37);
  dVar2 = *(double *)&peVar7->field_0x28;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)((long)&peVar7->super_ChNodeFEAbase + 0x20);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)&peVar7->field_0x30;
  dVar3 = *(double *)((long)&peVar7->X0 + 0x10);
  dVar4 = *(double *)((long)&peVar7->X0 + 0x18);
  dVar5 = (this->q_element_ref_rot).m_data[2];
  dVar18 = dVar54 * dVar48 - dVar79 * dVar37;
  dVar16 = dVar54 * dVar48 + dVar79 * dVar37;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar17 + dVar48 * dVar48;
  auVar30 = vfmadd213sd_avx512f(auVar86,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar17 + dVar54 * dVar54;
  auVar31 = vfmadd213sd_avx512f(auVar69,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar17 + dVar79 * dVar79;
  auVar39 = ZEXT816(0xbff0000000000000);
  auVar55 = ZEXT816(0x4000000000000000);
  auVar32 = vfmadd213sd_avx512f(auVar51,auVar55,auVar39);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar16 + dVar16;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar2 * auVar30._0_8_;
  auVar30 = vfmadd231sd_fma(auVar87,auVar126,auVar43);
  dVar19 = dVar48 * dVar79 - dVar54 * dVar37;
  dVar16 = dVar54 * dVar37 + dVar48 * dVar79;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar2 * (dVar18 + dVar18);
  auVar31 = vfmadd231sd_fma(auVar99,auVar126,auVar31);
  dVar17 = dVar48 * dVar37 + dVar54 * dVar79;
  dVar54 = dVar54 * dVar79 - dVar48 * dVar37;
  dVar37 = (this->q_element_ref_rot).m_data[3];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar19 + dVar19;
  auVar30 = vfmadd213sd_fma(auVar44,auVar131,auVar30);
  dVar48 = (this->q_element_ref_rot).m_data[1];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar17 + dVar17;
  auVar31 = vfmadd213sd_fma(auVar70,auVar131,auVar31);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar54 + dVar54;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar2 * (dVar16 + dVar16);
  auVar38 = vfmadd231sd_fma(auVar76,auVar126,auVar60);
  dVar54 = (this->q_element_ref_rot).m_data[0];
  auVar38 = vfmadd213sd_fma(auVar32,auVar131,auVar38);
  dVar16 = dVar54 * dVar54;
  dVar54 = (double)((ulong)local_48 ^ (ulong)dVar54);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)&((ChCoordsys<double> *)((long)&peVar7->X0 + 8))->pos;
  dVar2 = dVar48 * dVar5 - dVar37 * dVar54;
  dVar79 = dVar48 * dVar5 + dVar37 * dVar54;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar16 + dVar48 * dVar48;
  auVar32 = vfmadd213sd_avx512f(auVar100,auVar55,auVar39);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar3 * (dVar2 + dVar2);
  auVar32 = vfmadd231sd_fma(auVar133,auVar117,auVar32);
  dVar2 = dVar5 * dVar54 + dVar37 * dVar48;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar2 + dVar2;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar4;
  auVar32 = vfmadd213sd_avx512f(auVar101,auVar136,auVar32);
  dStack_60 = auVar31._0_8_ - auVar32._0_8_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar5 * dVar5 + dVar16;
  auVar31 = vfmadd213sd_avx512f(auVar102,auVar55,auVar39);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar37 * dVar37 + dVar16;
  auVar32 = vfmadd213sd_avx512f(auVar77,auVar55,auVar39);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar79 + dVar79;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar3 * auVar31._0_8_;
  auVar31 = vfmadd231sd_fma(auVar103,auVar117,auVar61);
  dVar79 = dVar37 * dVar5 - dVar48 * dVar54;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar79 + dVar79;
  auVar31 = vfmadd213sd_avx512f(auVar62,auVar136,auVar31);
  local_58 = auVar30._0_8_ - auVar31._0_8_;
  dVar79 = dVar37 * dVar48 - dVar5 * dVar54;
  dVar37 = dVar48 * dVar54 + dVar37 * dVar5;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar79 + dVar79;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar3 * (dVar37 + dVar37);
  auVar30 = vfmadd231sd_fma(auVar88,auVar117,auVar63);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar4;
  auVar30 = vfmadd213sd_avx512f(auVar32,auVar137,auVar30);
  local_50 = auVar38._0_8_ - auVar30._0_8_;
  if (lVar8 < 9) goto LAB_0066a553;
  pdVar6 = pdVar25 + 6;
  uVar28 = 3;
  if (((ulong)pdVar6 & 7) == 0) {
    uVar23 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
    if (uVar23 < 3) {
      uVar28 = uVar23;
    }
    if (uVar23 != 0) goto LAB_0066a25d;
  }
  else {
LAB_0066a25d:
    memcpy(pdVar6,&dStack_60,(ulong)(uVar28 * 8));
  }
  if (uVar28 < 3) {
    uVar29 = (ulong)(uVar28 << 3);
    memcpy((void *)((long)pdVar25 + uVar29 + 0x30),(void *)((long)&dStack_60 + uVar29),0x18 - uVar29
          );
  }
  dVar37 = (this->q_element_abs_rot).m_data[1];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar37;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(double *)&peVar7->field_0x40;
  dVar48 = *(double *)&peVar7->field_0x38;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar48;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = (this->q_element_abs_rot).m_data[0];
  dVar54 = (this->q_element_abs_rot).m_data[2];
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar54;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)&peVar7->field_0x48;
  dVar79 = (this->q_element_abs_rot).m_data[3];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar79;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)&peVar7->field_0x50;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(double *)&peVar7->field_0x40 * dVar37;
  auVar30 = vfmadd231sd_fma(auVar64,auVar45,auVar108);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar48 * dVar37;
  auVar31 = vfmsub231sd_fma(auVar71,auVar45,auVar112);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar48 * dVar54;
  auVar38 = vfmsub231sd_fma(auVar78,auVar45,auVar118);
  auVar30 = vfmadd231sd_fma(auVar30,auVar104,auVar118);
  auVar31 = vfmadd231sd_fma(auVar31,auVar89,auVar118);
  auVar38 = vfnmadd231sd_fma(auVar38,auVar89,auVar112);
  auVar30 = vfmadd231sd_fma(auVar30,auVar89,auVar122);
  auVar55 = vfnmadd231sd_fma(auVar31,auVar104,auVar122);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = (this->q_refrotB).m_data[2];
  auVar31 = vfmadd231sd_fma(auVar38,auVar52,auVar122);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar48 * dVar79;
  auVar38 = vfmsub231sd_fma(auVar90,auVar45,auVar122);
  auVar47 = SUB6416(ZEXT864(0),0);
  auVar38 = vfmadd231sd_fma(auVar38,auVar104,auVar112);
  dVar37 = (this->q_refrotB).m_data[0];
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar37;
  dVar48 = (this->q_refrotB).m_data[1];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar48;
  auVar56 = vfnmadd231sd_fma(auVar38,auVar52,auVar118);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = (this->q_refrotB).m_data[3];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar37 * auVar31._0_8_;
  auVar38 = vfnmadd231sd_fma(auVar127,auVar30,auVar109);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar37 * auVar55._0_8_;
  auVar32 = vfnmadd231sd_fma(auVar123,auVar30,auVar113);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar37 * auVar56._0_8_;
  auVar39 = vfnmadd231sd_fma(auVar129,auVar30,auVar53);
  auVar57 = vfnmadd231sd_fma(auVar38,auVar56,auVar113);
  auVar38 = vfmadd231sd_fma(auVar32,auVar56,auVar109);
  auVar32 = vfmadd231sd_fma(auVar39,auVar31,auVar113);
  auVar39 = vfmadd231sd_fma(auVar57,auVar55,auVar53);
  auVar57 = vfnmadd231sd_fma(auVar38,auVar31,auVar53);
  auVar32 = vfnmadd231sd_fma(auVar32,auVar55,auVar109);
  dVar37 = auVar39._0_8_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar37 * dVar37;
  auVar38 = vfmadd231sd_fma(auVar119,auVar57,auVar57);
  auVar38 = vfmadd231sd_fma(auVar38,auVar32,auVar32);
  if (auVar38._0_8_ <= 0.0) {
    local_98[0] = 0x3ff0000000000000;
    local_98[1] = 0;
    local_98[2] = 0;
  }
  else {
    dStack_70 = auVar57._0_8_;
    local_48 = auVar32._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar48 * auVar55._0_8_;
    auVar32 = vfmadd213sd_fma(auVar105,auVar30,auVar46);
    auVar30 = vsqrtsd_avx(auVar38,auVar38);
    auVar31 = vfmadd213sd_fma(auVar109,auVar31,auVar32);
    auVar31 = vfmadd213sd_fma(auVar53,auVar56,auVar31);
    dStack_78 = auVar30._0_8_;
    dStack_68 = dVar37;
    dVar37 = atan2(dStack_78,auVar31._0_8_);
    dVar37 = dVar37 + dVar37;
    dVar54 = 1.0 / dStack_78;
    dVar48 = dVar54 * dStack_68;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar54 * dStack_70;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar48 * dVar48;
    auVar30 = vfmadd231sd_fma(auVar91,auVar72,auVar72);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar54 * local_48;
    auVar30 = vfmadd231sd_fma(auVar30,auVar65,auVar65);
    auVar30 = vsqrtsd_avx(auVar30,auVar30);
    dVar79 = 1.0 / auVar30._0_8_;
    bVar9 = 2.2250738585072014e-308 <= auVar30._0_8_;
    local_98[0] = (ulong)bVar9 * (long)(dVar54 * dStack_70 * dVar79) +
                  (ulong)!bVar9 * 0x3ff0000000000000;
    local_98[1] = (ulong)bVar9 * (long)(dVar48 * dVar79);
    local_98[2] = (ulong)bVar9 * (long)(dVar54 * local_48 * dVar79);
    if (dVar37 <= 3.141592653589793) {
      if (dVar37 < -3.141592653589793) {
        dVar48 = 6.283185307179586;
        goto LAB_0066a494;
      }
    }
    else {
      dVar48 = -6.283185307179586;
LAB_0066a494:
      dVar37 = dVar37 + dVar48;
    }
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar37;
    if (3.141592653589793 < dVar37) {
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar37 + -6.283185307179586;
    }
  }
  if ((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 0xc) {
LAB_0066a553:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar6 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar28 = 3;
  pdVar25 = pdVar6 + 9;
  if (((ulong)pdVar25 & 7) == 0) {
    uVar23 = -((uint)((ulong)pdVar25 >> 3) & 0x1fffffff) & 7;
    if (uVar23 < 3) {
      uVar28 = uVar23;
    }
    if (uVar23 == 0) goto LAB_0066a509;
  }
  auVar34 = vbroadcastsd_avx512f(auVar47);
  auVar35 = vpbroadcastq_avx512f();
  uVar29 = vpcmpuq_avx512f(auVar35,_DAT_00974f00,5);
  auVar36._8_8_ = (ulong)((byte)(uVar29 >> 1) & 1) * local_98[1];
  auVar36._0_8_ = (ulong)((byte)uVar29 & 1) * local_98[0];
  auVar36._16_8_ = (ulong)((byte)(uVar29 >> 2) & 1) * local_98[2];
  auVar36._24_8_ = (ulong)((byte)(uVar29 >> 3) & 1) * local_98[3];
  auVar36._32_8_ = (ulong)((byte)(uVar29 >> 4) & 1) * (long)dStack_78;
  auVar36._40_8_ = (ulong)((byte)(uVar29 >> 5) & 1) * (long)dStack_70;
  auVar36._48_8_ = (ulong)((byte)(uVar29 >> 6) & 1) * (long)dStack_68;
  auVar36._56_8_ = (uVar29 >> 7) * (long)dStack_60;
  auVar34 = vmulpd_avx512f(auVar34,auVar36);
  bVar9 = (bool)((byte)uVar29 & 1);
  bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
  bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
  bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
  bVar13 = (bool)((byte)(uVar29 >> 4) & 1);
  bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
  bVar15 = (bool)((byte)(uVar29 >> 6) & 1);
  *pdVar25 = (double)((ulong)bVar9 * auVar34._0_8_ | (ulong)!bVar9 * (long)*pdVar25);
  pdVar6[10] = (double)((ulong)bVar10 * auVar34._8_8_ | (ulong)!bVar10 * (long)pdVar6[10]);
  pdVar6[0xb] = (double)((ulong)bVar11 * auVar34._16_8_ | (ulong)!bVar11 * (long)pdVar6[0xb]);
  pdVar6[0xc] = (double)((ulong)bVar12 * auVar34._24_8_ | (ulong)!bVar12 * (long)pdVar6[0xc]);
  pdVar6[0xd] = (double)((ulong)bVar13 * auVar34._32_8_ | (ulong)!bVar13 * (long)pdVar6[0xd]);
  pdVar6[0xe] = (double)((ulong)bVar14 * auVar34._40_8_ | (ulong)!bVar14 * (long)pdVar6[0xe]);
  pdVar6[0xf] = (double)((ulong)bVar15 * auVar34._48_8_ | (ulong)!bVar15 * (long)pdVar6[0xf]);
  pdVar6[0x10] = (double)((uVar29 >> 7) * auVar34._56_8_ |
                         (ulong)!SUB81(uVar29 >> 7,0) * (long)pdVar6[0x10]);
LAB_0066a509:
  if (uVar28 < 3) {
    dVar37 = auVar47._0_8_;
    uVar27 = (ulong)(uVar28 << 3);
    auVar33 = vpbroadcastq_avx512vl();
    uVar29 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
    uVar29 = uVar29 & 0xf;
    lVar8 = *(long *)((long)local_98 + uVar27 + 8);
    lVar20 = *(long *)((long)local_98 + uVar27 + 0x10);
    lVar21 = *(long *)((long)local_98 + uVar27 + 0x18);
    puVar1 = (ulong *)((long)pdVar25 + uVar27);
    bVar9 = (bool)((byte)uVar29 & 1);
    bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
    bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
    *puVar1 = (ulong)bVar9 *
              (long)(dVar37 * (double)((ulong)((byte)uVar29 & 1) *
                                      *(long *)((long)local_98 + uVar27))) | (ulong)!bVar9 * *puVar1
    ;
    puVar1[1] = (ulong)bVar10 * (long)(dVar37 * (double)((ulong)((byte)(uVar29 >> 1) & 1) * lVar8))
                | (ulong)!bVar10 * puVar1[1];
    puVar1[2] = (ulong)bVar11 * (long)(dVar37 * (double)((ulong)((byte)(uVar29 >> 2) & 1) * lVar20))
                | (ulong)!bVar11 * puVar1[2];
    puVar1[3] = (uVar29 >> 3) * (long)(dVar37 * (double)((uVar29 >> 3) * lVar21)) |
                (ulong)!SUB81(uVar29 >> 3,0) * puVar1[3];
  }
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.resize(12);

    ChVector<> delta_rot_dir;
    double delta_rot_angle;

    // Node 0, displacement (in local element frame, corotated back)
    //     d = [Atw]' Xt - [A0w]'X0
    ChVector<> displ = this->q_element_abs_rot.RotateBack(nodes[0]->Frame().GetPos()) -
                       this->q_element_ref_rot.RotateBack(nodes[0]->GetX0().GetPos());
    mD.segment(0, 3) = displ.eigen();

    // Node 0, x,y,z small rotations (in local element frame)
    ChQuaternion<> q_delta0 = q_element_abs_rot.GetConjugate() % nodes[0]->Frame().GetRot() % q_refrotA.GetConjugate();
    // note, for small incremental rotations this is opposite of ChNodeFEAxyzrot::VariablesQbIncrementPosition
    q_delta0.Q_to_AngAxis(delta_rot_angle, delta_rot_dir);

    if (delta_rot_angle > CH_C_PI)
        delta_rot_angle -= CH_C_2PI;  // no 0..360 range, use -180..+180

    mD.segment(3, 3) = delta_rot_angle * delta_rot_dir.eigen();

    // Node 1, displacement (in local element frame, corotated back)
    //     d = [Atw]' Xt - [A0w]'X0
    displ = this->q_element_abs_rot.RotateBack(nodes[1]->Frame().GetPos()) -
            this->q_element_ref_rot.RotateBack(nodes[1]->GetX0().GetPos());
    mD.segment(6, 3) = displ.eigen();

    // Node 1, x,y,z small rotations (in local element frame)
    ChQuaternion<> q_delta1 = q_element_abs_rot.GetConjugate() % nodes[1]->Frame().GetRot() % q_refrotB.GetConjugate();
    // note, for small incremental rotations this is opposite of ChNodeFEAxyzrot::VariablesQbIncrementPosition
    q_delta1.Q_to_AngAxis(delta_rot_angle, delta_rot_dir);

    if (delta_rot_angle > CH_C_PI)
        delta_rot_angle -= CH_C_2PI;  // no 0..360 range, use -180..+180

    mD.segment(9, 3) = delta_rot_angle * delta_rot_dir.eigen();
}